

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

void HashmapSortRehash(jx9_hashmap *pMap)

{
  jx9_hashmap_node *pjVar1;
  jx9_hashmap_node *pEntry;
  uint uVar2;
  
  pEntry = pMap->pFirst;
  pMap->iNextIdx = 0;
  if (pMap->nEntry != 0) {
    uVar2 = 0;
    pjVar1 = pEntry;
    do {
      pEntry = pjVar1;
      if (pEntry->iType == 2) {
        SyBlobRelease(&(pEntry->xKey).sKey);
        pEntry->iType = 1;
      }
      HashmapRehashIntNode(pEntry);
      uVar2 = uVar2 + 1;
      pjVar1 = pEntry->pPrev;
    } while (uVar2 < pMap->nEntry);
  }
  pMap->pLast = pEntry;
  return;
}

Assistant:

static void HashmapSortRehash(jx9_hashmap *pMap)
{
	jx9_hashmap_node *p, *pLast;
	sxu32 i;
	/* Rehash all entries */
	pLast = p = pMap->pFirst;
	pMap->iNextIdx = 0; /* Reset the automatic index */
	i = 0;
	for( ;; ){
		if( i >= pMap->nEntry ){
			pMap->pLast = pLast; /* Fix the last link broken by the merge-sort */
			break;
		}
		if( p->iType == HASHMAP_BLOB_NODE ){
			/* Do not maintain index association as requested by the JX9 specification */
			SyBlobRelease(&p->xKey.sKey);
			/* Change key type */
			p->iType = HASHMAP_INT_NODE;
		}
		HashmapRehashIntNode(p);
		/* Point to the next entry */
		i++;
		pLast = p;
		p = p->pPrev; /* Reverse link */
	}
}